

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

OPJ_BOOL opj_t1_decode_cblks(opj_t1_t *t1,opj_tcd_tilecomp_t *tilec,opj_tccp_t *tccp)

{
  byte *pbVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  int iVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_precinct_t *poVar6;
  opj_tcd_cblk_enc_t *poVar7;
  opj_mqc_t *mqc;
  opj_raw_t *raw;
  opj_tcd_layer_t *poVar8;
  long *plVar9;
  opj_mqc_t *poVar10;
  opj_raw_t *raw_00;
  opj_mqc_t *poVar11;
  uint uVar12;
  OPJ_BOOL OVar13;
  OPJ_UINT32 OVar14;
  uint uVar15;
  OPJ_UINT32 OVar16;
  OPJ_INT32 OVar17;
  uint uVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  opj_tcd_band_t *poVar32;
  ulong uVar33;
  uint uVar34;
  ushort *puVar35;
  ushort uVar36;
  OPJ_INT32 *pOVar37;
  ushort uVar38;
  int *piVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  int iVar43;
  uint *datap;
  opj_flag_t *poVar44;
  OPJ_INT32 *pOVar45;
  uint uVar46;
  ulong uVar47;
  byte bVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  ulong uVar52;
  bool bVar53;
  OPJ_INT32 *local_160;
  opj_flag_t *local_158;
  opj_flag_t *local_150;
  opj_flag_t *local_140;
  uint local_10c;
  uint local_c8;
  uint local_b0;
  
  uVar12 = tilec->x1 - tilec->x0;
  uVar28 = 0;
  do {
    if (tilec->minimum_num_resolutions <= uVar28) {
      return 1;
    }
    poVar5 = tilec->resolutions;
    uVar21 = (int)uVar28 - 1;
    for (uVar41 = 0; uVar41 < poVar5[uVar28].numbands; uVar41 = uVar41 + 1) {
      poVar32 = poVar5[uVar28].bands + uVar41;
      for (uVar40 = 0; uVar40 < poVar5[uVar28].ph * poVar5[uVar28].pw; uVar40 = uVar40 + 1) {
        poVar6 = poVar32->precincts;
        for (uVar42 = 0; uVar42 < poVar6[uVar40].ch * poVar6[uVar40].cw; uVar42 = uVar42 + 1) {
          poVar7 = poVar6[uVar40].cblks.enc;
          OVar2 = poVar32->bandno;
          iVar29 = tccp->roishift;
          uVar3 = tccp->cblksty;
          mqc = t1->mqc;
          raw = t1->raw;
          OVar13 = opj_t1_allocate_buffers
                             (t1,poVar7[uVar42].x0 - *(int *)&poVar7[uVar42].passes,
                              poVar7[uVar42].y0 - *(int *)((long)&poVar7[uVar42].passes + 4));
          if (OVar13 == 0) {
            return 0;
          }
          uVar49 = iVar29 + poVar7[uVar42].x1;
          opj_mqc_resetstates(mqc);
          opj_mqc_setstate(mqc,0x12,0,0x2e);
          opj_mqc_setstate(mqc,0x11,0,3);
          opj_mqc_setstate(mqc,0,0,4);
          local_10c = 2;
          for (uVar19 = 0; uVar19 < poVar7[uVar42].numpassesinlayers; uVar19 = uVar19 + 1) {
            poVar8 = poVar7[uVar42].layers;
            lVar22 = uVar19 * 0x28;
            plVar9 = *(long **)((long)poVar8 + lVar22);
            if ((poVar7[uVar42].x1 + -4 < (int)uVar49) || (1 < local_10c)) {
              if (plVar9 != (long *)0x0) {
LAB_0011ea0e:
                OVar13 = opj_mqc_init_dec(mqc,(OPJ_BYTE *)
                                              ((ulong)*(uint *)((long)poVar8 + lVar22 + 8) + *plVar9
                                              ),*(OPJ_UINT32 *)((long)poVar8 + lVar22 + 0x14));
                bVar20 = 1;
                if (OVar13 == 0) {
                  return 0;
                }
                goto LAB_0011ea36;
              }
            }
            else if (plVar9 != (long *)0x0) {
              if ((uVar3 & 1) == 0) goto LAB_0011ea0e;
              opj_raw_init_dec(raw,(OPJ_BYTE *)
                                   ((ulong)*(uint *)((long)poVar8 + lVar22 + 8) + *plVar9),
                               *(OPJ_UINT32 *)((long)poVar8 + lVar22 + 0x14));
              bVar20 = 0;
LAB_0011ea36:
              uVar24 = 0;
              for (; (uVar24 < *(uint *)((long)poVar8 + lVar22 + 0x10) && (0 < (int)uVar49));
                  uVar49 = uVar49 - bVar53) {
                bVar48 = (byte)uVar49;
                if (local_10c == 2) {
                  uVar50 = (1 << (bVar48 & 0x1f)) >> 1 | 1 << (uVar49 & 0x1f);
                  poVar11 = t1->mqc;
                  if ((uVar3 & 8) == 0) {
                    local_160 = t1->data;
                    local_150 = t1->flags + 1;
                    uVar31 = 0;
                    while (uVar51 = t1->h, uVar31 < (uVar51 & 0xfffffffc)) {
                      uVar51 = uVar31 | 1;
                      uVar46 = uVar31 | 2;
                      uVar34 = uVar31 | 3;
                      uVar31 = uVar31 + 4;
                      uVar23 = 0;
                      while( true ) {
                        uVar47 = uVar23;
                        uVar25 = t1->flags_stride;
                        if (t1->w <= uVar47) break;
                        pOVar37 = local_160 + uVar47;
                        poVar44 = t1->flags;
                        uVar23 = uVar47 + 1;
                        iVar29 = (int)uVar23;
                        if (((poVar44[uVar25 * uVar46 + iVar29] | poVar44[uVar25 * uVar51 + iVar29]
                              | poVar44[uVar25 * uVar34 + iVar29] |
                             poVar44[uVar25 * uVar31 + iVar29]) & 0x50ffU) == 0) {
                          poVar11->curctx = poVar11->ctxs + 0x11;
                          OVar17 = opj_mqc_decode(poVar11);
                          if (OVar17 != 0) {
                            poVar11->curctx = poVar11->ctxs + 0x12;
                            OVar17 = opj_mqc_decode(poVar11);
                            uVar25 = opj_mqc_decode(poVar11);
                            uVar25 = uVar25 | OVar17 * 2;
                            puVar35 = (ushort *)(local_150 + uVar47 + t1->flags_stride * uVar25);
                            datap = (uint *)(pOVar37 + t1->w * uVar25);
                            for (iVar29 = 0; (iVar29 + uVar25 < 4 && (iVar29 + uVar25 < t1->h));
                                iVar29 = iVar29 + 1) {
                              puVar35 = puVar35 + t1->flags_stride;
                              if (iVar29 == 0) {
                                poVar10 = t1->mqc;
                                uVar26 = *puVar35 >> 4 & 0xff;
                                poVar10->curctx =
                                     poVar10->ctxs +
                                     "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                     [uVar26];
                                uVar18 = opj_mqc_decode(poVar10);
                                bVar48 = ""[uVar26];
                                uVar26 = -uVar50;
                                if (uVar18 == bVar48) {
                                  uVar26 = uVar50;
                                }
                                *datap = uVar26;
                                opj_t1_updateflags((opj_flag_t *)puVar35,uVar18 ^ bVar48,
                                                   t1->flags_stride);
                                *(byte *)((long)puVar35 + 1) = *(byte *)((long)puVar35 + 1) & 0xbf;
                              }
                              else {
                                opj_t1_dec_clnpass_step
                                          (t1,(opj_flag_t *)puVar35,(OPJ_INT32 *)datap,OVar2,uVar50)
                                ;
                              }
                              datap = datap + t1->w;
                            }
                          }
                        }
                        else {
                          poVar44 = local_150 + uVar47 + uVar25;
                          opj_t1_dec_clnpass_step(t1,poVar44,pOVar37,OVar2,uVar50);
                          pOVar37 = pOVar37 + t1->w;
                          poVar44 = poVar44 + t1->flags_stride;
                          opj_t1_dec_clnpass_step(t1,poVar44,pOVar37,OVar2,uVar50);
                          uVar25 = t1->w;
                          uVar26 = t1->flags_stride;
                          opj_t1_dec_clnpass_step(t1,poVar44 + uVar26,pOVar37 + uVar25,OVar2,uVar50)
                          ;
                          opj_t1_dec_clnpass_step
                                    (t1,poVar44 + uVar26 + t1->flags_stride,pOVar37 + uVar25 + t1->w
                                     ,OVar2,uVar50);
                        }
                      }
                      local_160 = local_160 + (t1->w << 2);
                      local_150 = local_150 + (uVar25 << 2);
                    }
                    uVar23 = (ulong)t1->w;
                    for (uVar47 = 0; uVar47 < uVar23; uVar47 = uVar47 + 1) {
                      pOVar37 = local_160 + uVar47;
                      poVar44 = local_150 + uVar47;
                      for (uVar46 = uVar31; uVar46 < uVar51; uVar46 = uVar46 + 1) {
                        poVar44 = poVar44 + t1->flags_stride;
                        opj_t1_dec_clnpass_step(t1,poVar44,pOVar37,OVar2,uVar50);
                        uVar23 = (ulong)t1->w;
                        uVar51 = t1->h;
                        pOVar37 = pOVar37 + uVar23;
                      }
                    }
                  }
                  else {
                    uVar31 = 0;
                    while (uVar51 = uVar31, uVar51 < t1->h) {
                      local_c8 = uVar51 | 3;
                      local_b0 = uVar51 | 1;
                      uVar31 = uVar51 + 4;
                      uVar46 = 0;
                      while (uVar34 = uVar46, uVar34 < t1->w) {
                        if (t1->h <= local_c8) {
                          uVar25 = 0;
                          bVar53 = true;
                          goto LAB_0011f23d;
                        }
                        poVar44 = t1->flags;
                        OVar14 = t1->flags_stride;
                        uVar46 = uVar34 + 1;
                        uVar25 = 0;
                        bVar53 = true;
                        if (((((poVar44[OVar14 * local_b0 + uVar34 + 1] & 0x50ffU) != 0) ||
                             ((poVar44[OVar14 * (uVar51 | 2) + uVar46] & 0x50ffU) != 0)) ||
                            ((poVar44[OVar14 * local_c8 + uVar46] & 0x50ffU) != 0)) ||
                           ((poVar44[OVar14 * uVar31 + uVar46] & 0x50b9U) != 0)) goto LAB_0011f23d;
                        poVar11->curctx = poVar11->ctxs + 0x11;
                        OVar17 = opj_mqc_decode(poVar11);
                        if (OVar17 != 0) {
                          poVar11->curctx = poVar11->ctxs + 0x12;
                          OVar17 = opj_mqc_decode(poVar11);
                          uVar25 = opj_mqc_decode(poVar11);
                          uVar25 = uVar25 | OVar17 * 2;
                          bVar53 = false;
LAB_0011f23d:
                          uVar46 = uVar34 + 1;
                          uVar26 = uVar25 + uVar51;
                          iVar29 = 0;
                          while ((uVar26 < uVar31 && (uVar26 < t1->h))) {
                            OVar14 = t1->w;
                            puVar35 = (ushort *)
                                      (t1->flags + (t1->flags_stride * (uVar26 + 1) + uVar46));
                            uVar38 = *puVar35 & 0xfbb9;
                            uVar36 = *puVar35;
                            if (uVar26 == t1->h - 1) {
                              uVar36 = uVar38;
                            }
                            poVar10 = t1->mqc;
                            pOVar37 = t1->data;
                            if (uVar25 - 3 == iVar29) {
                              uVar36 = uVar38;
                            }
                            if (iVar29 == 0 && !bVar53) {
LAB_0011f316:
                              uVar18 = uVar36 >> 4 & 0xff;
                              poVar10->curctx =
                                   poVar10->ctxs +
                                   "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                   [uVar18];
                              uVar15 = opj_mqc_decode(poVar10);
                              bVar48 = ""[uVar18];
                              uVar18 = -uVar50;
                              if (uVar15 == bVar48) {
                                uVar18 = uVar50;
                              }
                              pOVar37[OVar14 * uVar26 + uVar34] = uVar18;
                              opj_t1_updateflags((opj_flag_t *)puVar35,uVar15 ^ bVar48,
                                                 t1->flags_stride);
                            }
                            else if ((uVar36 & 0x5000) == 0) {
                              poVar10->curctx = poVar10->ctxs + ""[uVar36 & 0xff | OVar2 << 8];
                              OVar17 = opj_mqc_decode(poVar10);
                              if (OVar17 != 0) goto LAB_0011f316;
                            }
                            *(byte *)((long)puVar35 + 1) = *(byte *)((long)puVar35 + 1) & 0xbf;
                            uVar26 = uVar26 + 1;
                            iVar29 = iVar29 + -1;
                          }
                        }
                      }
                    }
                  }
                  if ((uVar3 & 0x20) != 0) {
                    poVar11->curctx = poVar11->ctxs + 0x12;
                    opj_mqc_decode(poVar11);
                    opj_mqc_decode(poVar11);
                    opj_mqc_decode(poVar11);
                    opj_mqc_decode(poVar11);
                  }
                }
                else if (local_10c == 1) {
                  if (bVar20 == 0) {
                    iVar29 = (1 << (bVar48 & 0x1f)) >> 1;
                    uVar50 = 0;
                    while (uVar31 = uVar50, uVar31 < t1->h) {
                      uVar50 = 0;
                      while (uVar51 = uVar50, uVar50 = uVar31 + 4, uVar51 < t1->w) {
                        uVar50 = uVar51 + 1;
                        uVar46 = uVar31;
                        while ((uVar34 = uVar46, uVar34 < uVar31 + 4 && (uVar34 < t1->h))) {
                          poVar44 = t1->flags;
                          uVar46 = uVar34 + 1;
                          uVar23 = (ulong)(t1->flags_stride * uVar46 + uVar50);
                          if ((poVar44[uVar23] & 0x5000U) == 0x1000) {
                            pOVar37 = t1->data;
                            uVar34 = uVar34 * t1->w + uVar51;
                            OVar14 = opj_raw_decode(t1->raw);
                            iVar30 = iVar29;
                            if (OVar14 == 0) {
                              iVar30 = -iVar29;
                            }
                            iVar4 = pOVar37[uVar34];
                            iVar43 = -iVar30;
                            if (-1 < iVar4) {
                              iVar43 = iVar30;
                            }
                            pOVar37[uVar34] = iVar43 + iVar4;
                            pbVar1 = (byte *)((long)poVar44 + uVar23 * 2 + 1);
                            *pbVar1 = *pbVar1 | 0x20;
                          }
                        }
                      }
                    }
                  }
                  else if ((uVar3 & 8) == 0) {
                    pOVar37 = t1->data;
                    local_140 = t1->flags + 1;
                    iVar29 = (1 << (bVar48 & 0x1f)) >> 1;
                    iVar30 = -iVar29;
                    for (uVar50 = 0; uVar31 = t1->h, uVar50 < (uVar31 & 0xfffffffc);
                        uVar50 = uVar50 + 4) {
                      poVar44 = local_140;
                      pOVar45 = pOVar37;
                      for (uVar23 = 0; uVar23 < t1->w; uVar23 = uVar23 + 1) {
                        uVar52 = (ulong)t1->flags_stride;
                        opj_t1_dec_refpass_step_mqc(t1,poVar44 + uVar52,pOVar45,iVar29,iVar30);
                        uVar33 = (ulong)t1->w;
                        uVar47 = (ulong)t1->flags_stride;
                        opj_t1_dec_refpass_step_mqc
                                  (t1,poVar44 + uVar52 + uVar47,pOVar45 + uVar33,iVar29,iVar30);
                        uVar31 = t1->w;
                        uVar51 = t1->flags_stride;
                        opj_t1_dec_refpass_step_mqc
                                  (t1,poVar44 + (ulong)uVar51 + uVar52 + uVar47,
                                   pOVar45 + uVar33 + uVar31,iVar29,iVar30);
                        opj_t1_dec_refpass_step_mqc
                                  (t1,poVar44 + (ulong)t1->flags_stride +
                                                (ulong)uVar51 + uVar52 + uVar47,
                                   pOVar45 + (ulong)t1->w + uVar33 + uVar31,iVar29,iVar30);
                        poVar44 = poVar44 + 1;
                        pOVar45 = pOVar45 + 1;
                      }
                      pOVar37 = pOVar37 + (t1->w << 2);
                      local_140 = local_140 + (t1->flags_stride << 2);
                    }
                    uVar23 = (ulong)t1->w;
                    for (uVar47 = 0; uVar47 < uVar23; uVar47 = uVar47 + 1) {
                      pOVar45 = pOVar37 + uVar47;
                      poVar44 = local_140 + uVar47;
                      for (uVar51 = uVar50; uVar51 < uVar31; uVar51 = uVar51 + 1) {
                        poVar44 = poVar44 + t1->flags_stride;
                        opj_t1_dec_refpass_step_mqc(t1,poVar44,pOVar45,iVar29,iVar30);
                        uVar23 = (ulong)t1->w;
                        uVar31 = t1->h;
                        pOVar45 = pOVar45 + uVar23;
                      }
                    }
                  }
                  else {
                    iVar29 = (1 << (bVar48 & 0x1f)) >> 1;
                    uVar50 = 0;
                    while (uVar31 = uVar50, uVar31 < t1->h) {
                      uVar50 = 0;
                      while (uVar51 = uVar50, uVar50 = uVar31 + 4, uVar51 < t1->w) {
                        uVar50 = uVar51 + 1;
                        iVar30 = 3;
                        uVar46 = uVar31;
                        while ((uVar34 = uVar46, uVar34 < uVar31 + 4 && (uVar34 < t1->h))) {
                          poVar44 = t1->flags;
                          uVar46 = uVar34 + 1;
                          uVar23 = (ulong)(t1->flags_stride * uVar46 + uVar50);
                          uVar25 = (uint)(ushort)poVar44[uVar23];
                          uVar26 = uVar25 & 0xfffffbb9;
                          if (uVar34 == t1->h - 1) {
                            uVar25 = uVar26;
                          }
                          bVar53 = iVar30 == 0;
                          iVar30 = iVar30 + -1;
                          if (bVar53) {
                            uVar25 = uVar26;
                          }
                          if ((uVar25 & 0x5000) == 0x1000) {
                            poVar11 = t1->mqc;
                            pOVar37 = t1->data;
                            uVar34 = uVar34 * t1->w + uVar51;
                            uVar47 = (ulong)(0xf - ((char)uVar25 == '\0'));
                            if ((uVar25 >> 0xd & 1) != 0) {
                              uVar47 = 0x10;
                            }
                            poVar11->curctx = poVar11->ctxs + uVar47;
                            OVar17 = opj_mqc_decode(poVar11);
                            iVar4 = iVar29;
                            if (OVar17 == 0) {
                              iVar4 = -iVar29;
                            }
                            iVar43 = pOVar37[uVar34];
                            iVar27 = -iVar4;
                            if (-1 < iVar43) {
                              iVar27 = iVar4;
                            }
                            pOVar37[uVar34] = iVar27 + iVar43;
                            pbVar1 = (byte *)((long)poVar44 + uVar23 * 2 + 1);
                            *pbVar1 = *pbVar1 | 0x20;
                          }
                        }
                      }
                    }
                  }
                }
                else if (bVar20 == 0) {
                  uVar31 = (1 << (bVar48 & 0x1f)) >> 1 | 1 << (uVar49 & 0x1f);
                  uVar50 = 0;
                  while (uVar51 = uVar50, uVar51 < t1->h) {
                    uVar50 = 0;
                    while (uVar46 = uVar50, uVar50 = uVar51 + 4, uVar46 < t1->w) {
                      uVar50 = uVar46 + 1;
                      iVar29 = 3;
                      uVar34 = uVar51;
                      while ((uVar34 < uVar51 + 4 && (uVar34 < t1->h))) {
                        bVar53 = true;
                        if ((uVar3 & 8) != 0) {
                          if (iVar29 == 0) {
                            bVar53 = false;
                          }
                          else {
                            bVar53 = uVar34 != t1->h - 1;
                          }
                        }
                        uVar25 = t1->flags_stride * (uVar34 + 1) + uVar50;
                        uVar36 = t1->flags[uVar25];
                        uVar38 = uVar36 & 0xfbb9;
                        if (bVar53) {
                          uVar38 = uVar36;
                        }
                        if ((uVar38 & 0x5000) == 0 && (char)uVar38 != '\0') {
                          poVar44 = t1->flags + uVar25;
                          raw_00 = t1->raw;
                          pOVar37 = t1->data;
                          OVar14 = t1->w;
                          OVar16 = opj_raw_decode(raw_00);
                          if (OVar16 != 0) {
                            OVar16 = opj_raw_decode(raw_00);
                            uVar25 = -uVar31;
                            if (OVar16 == 0) {
                              uVar25 = uVar31;
                            }
                            pOVar37[uVar34 * OVar14 + uVar46] = uVar25;
                            opj_t1_updateflags(poVar44,OVar16,t1->flags_stride);
                          }
                          pbVar1 = (byte *)((long)poVar44 + 1);
                          *pbVar1 = *pbVar1 | 0x40;
                        }
                        iVar29 = iVar29 + -1;
                        uVar34 = uVar34 + 1;
                      }
                    }
                  }
                }
                else if ((uVar3 & 8) == 0) {
                  pOVar37 = t1->data;
                  local_158 = t1->flags + 1;
                  uVar31 = (1 << (bVar48 & 0x1f)) >> 1 | 1 << (uVar49 & 0x1f);
                  for (uVar50 = 0; uVar51 = t1->h, uVar50 < (uVar51 & 0xfffffffc);
                      uVar50 = uVar50 + 4) {
                    poVar44 = local_158;
                    pOVar45 = pOVar37;
                    for (uVar23 = 0; uVar23 < t1->w; uVar23 = uVar23 + 1) {
                      uVar52 = (ulong)t1->flags_stride;
                      opj_t1_dec_sigpass_step_mqc(t1,poVar44 + uVar52,pOVar45,OVar2,uVar31);
                      uVar33 = (ulong)t1->w;
                      uVar47 = (ulong)t1->flags_stride;
                      opj_t1_dec_sigpass_step_mqc
                                (t1,poVar44 + uVar52 + uVar47,pOVar45 + uVar33,OVar2,uVar31);
                      uVar51 = t1->w;
                      uVar46 = t1->flags_stride;
                      opj_t1_dec_sigpass_step_mqc
                                (t1,poVar44 + (ulong)uVar46 + uVar52 + uVar47,
                                 pOVar45 + uVar33 + uVar51,OVar2,uVar31);
                      opj_t1_dec_sigpass_step_mqc
                                (t1,poVar44 + (ulong)t1->flags_stride +
                                              (ulong)uVar46 + uVar52 + uVar47,
                                 pOVar45 + (ulong)t1->w + uVar33 + uVar51,OVar2,uVar31);
                      poVar44 = poVar44 + 1;
                      pOVar45 = pOVar45 + 1;
                    }
                    pOVar37 = pOVar37 + (t1->w << 2);
                    local_158 = local_158 + (t1->flags_stride << 2);
                  }
                  uVar23 = (ulong)t1->w;
                  for (uVar47 = 0; uVar47 < uVar23; uVar47 = uVar47 + 1) {
                    pOVar45 = pOVar37 + uVar47;
                    poVar44 = local_158 + uVar47;
                    for (uVar46 = uVar50; uVar46 < uVar51; uVar46 = uVar46 + 1) {
                      poVar44 = poVar44 + t1->flags_stride;
                      opj_t1_dec_sigpass_step_mqc(t1,poVar44,pOVar45,OVar2,uVar31);
                      uVar23 = (ulong)t1->w;
                      uVar51 = t1->h;
                      pOVar45 = pOVar45 + uVar23;
                    }
                  }
                }
                else {
                  uVar31 = (1 << (bVar48 & 0x1f)) >> 1 | 1 << (uVar49 & 0x1f);
                  uVar50 = 0;
                  while (uVar51 = uVar50, uVar51 < t1->h) {
                    uVar50 = 0;
                    while (uVar46 = uVar50, uVar50 = uVar51 + 4, uVar46 < t1->w) {
                      uVar50 = uVar46 + 1;
                      iVar29 = 3;
                      uVar34 = uVar51;
                      while ((uVar25 = uVar34, uVar25 < uVar51 + 4 && (uVar25 < t1->h))) {
                        uVar34 = uVar25 + 1;
                        uVar26 = t1->flags_stride * uVar34 + uVar50;
                        uVar36 = t1->flags[uVar26];
                        uVar38 = uVar36 & 0xfbb9;
                        if (uVar25 == t1->h - 1) {
                          uVar36 = uVar38;
                        }
                        bVar53 = iVar29 == 0;
                        iVar29 = iVar29 + -1;
                        if (bVar53) {
                          uVar36 = uVar38;
                        }
                        if ((uVar36 & 0x5000) == 0 && (uVar36 & 0xff) != 0) {
                          OVar14 = t1->w;
                          poVar44 = t1->flags + uVar26;
                          poVar11 = t1->mqc;
                          pOVar37 = t1->data;
                          poVar11->curctx = poVar11->ctxs + ""[uVar36 & 0xff | OVar2 << 8];
                          OVar17 = opj_mqc_decode(poVar11);
                          if (OVar17 != 0) {
                            bVar48 = (byte)(uVar36 >> 4);
                            poVar11->curctx =
                                 poVar11->ctxs +
                                 "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                 [bVar48];
                            uVar18 = opj_mqc_decode(poVar11);
                            bVar48 = ""[bVar48];
                            uVar26 = -uVar31;
                            if (uVar18 == bVar48) {
                              uVar26 = uVar31;
                            }
                            pOVar37[uVar25 * OVar14 + uVar46] = uVar26;
                            opj_t1_updateflags(poVar44,uVar18 ^ bVar48,t1->flags_stride);
                          }
                          pbVar1 = (byte *)((long)poVar44 + 1);
                          *pbVar1 = *pbVar1 | 0x40;
                        }
                      }
                    }
                  }
                }
                if (((byte)uVar3 >> 1 & bVar20) != 0) {
                  opj_mqc_resetstates(mqc);
                  opj_mqc_setstate(mqc,0x12,0,0x2e);
                  opj_mqc_setstate(mqc,0x11,0,3);
                  opj_mqc_setstate(mqc,0,0,4);
                }
                local_10c = local_10c + 1;
                bVar53 = local_10c == 3;
                if (bVar53) {
                  local_10c = 0;
                }
                uVar24 = uVar24 + 1;
              }
            }
          }
          iVar29 = *(int *)&poVar7[uVar42].passes - poVar32->x0;
          if ((poVar32->bandno & 1) != 0) {
            iVar29 = (iVar29 + tilec->resolutions[uVar21].x1) - tilec->resolutions[uVar21].x0;
          }
          iVar30 = *(int *)((long)&poVar7[uVar42].passes + 4) - poVar32->y0;
          if ((poVar32->bandno & 2) != 0) {
            iVar30 = (iVar30 + tilec->resolutions[uVar21].y1) - tilec->resolutions[uVar21].y0;
          }
          piVar39 = t1->data;
          uVar3 = t1->w;
          OVar2 = t1->h;
          iVar4 = tccp->roishift;
          if (iVar4 != 0) {
            uVar19 = 0;
            for (OVar14 = 0; OVar14 != OVar2; OVar14 = OVar14 + 1) {
              iVar43 = (int)uVar19;
              uVar23 = (ulong)uVar3;
              while (bVar53 = uVar23 != 0, uVar23 = uVar23 - 1, bVar53) {
                uVar49 = piVar39[uVar19];
                uVar24 = -uVar49;
                if (0 < (int)uVar49) {
                  uVar24 = uVar49;
                }
                if (1 << ((byte)iVar4 & 0x1f) <= (int)uVar24) {
                  uVar24 = uVar24 >> ((byte)tccp->roishift & 0x1f);
                  uVar50 = -uVar24;
                  if (-1 < (int)uVar49) {
                    uVar50 = uVar24;
                  }
                  piVar39[uVar19] = uVar50;
                }
                uVar19 = (ulong)((int)uVar19 + 1);
              }
              uVar19 = (ulong)(iVar43 + uVar3);
            }
          }
          pOVar37 = tilec->data + (iVar30 * uVar12 + iVar29);
          if (tccp->qmfbid == 1) {
            uVar49 = 0;
            uVar19 = 0;
            for (OVar14 = 0; OVar14 != OVar2; OVar14 = OVar14 + 1) {
              iVar29 = (int)uVar19;
              uVar23 = (ulong)uVar3;
              uVar24 = uVar49;
              while( true ) {
                bVar53 = uVar23 == 0;
                uVar23 = uVar23 - 1;
                if (bVar53) break;
                pOVar37[uVar19] = piVar39[uVar24] / 2;
                uVar19 = (ulong)((int)uVar19 + 1);
                uVar24 = uVar24 + 1;
              }
              uVar19 = (ulong)(iVar29 + uVar12);
              uVar49 = uVar49 + uVar3;
            }
          }
          else {
            for (OVar14 = 0; OVar14 != OVar2; OVar14 = OVar14 + 1) {
              for (lVar22 = 0; uVar3 != (uint)lVar22; lVar22 = lVar22 + 1) {
                pOVar37[lVar22] = (OPJ_INT32)((float)*piVar39 * (float)poVar32->stepsize);
                piVar39 = piVar39 + 1;
              }
              pOVar37 = pOVar37 + uVar12;
            }
          }
        }
      }
    }
    uVar28 = uVar28 + 1;
  } while( true );
}

Assistant:

OPJ_BOOL opj_t1_decode_cblks(   opj_t1_t* t1,
                            opj_tcd_tilecomp_t* tilec,
                            opj_tccp_t* tccp
                            )
{
	OPJ_UINT32 resno, bandno, precno, cblkno;
	OPJ_UINT32 tile_w = (OPJ_UINT32)(tilec->x1 - tilec->x0);

	for (resno = 0; resno < tilec->minimum_num_resolutions; ++resno) {
		opj_tcd_resolution_t* res = &tilec->resolutions[resno];

		for (bandno = 0; bandno < res->numbands; ++bandno) {
			opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];

			for (precno = 0; precno < res->pw * res->ph; ++precno) {
				opj_tcd_precinct_t* precinct = &band->precincts[precno];

				for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
					opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
					OPJ_INT32* OPJ_RESTRICT datap;
					OPJ_UINT32 cblk_w, cblk_h;
					OPJ_INT32 x, y;
					OPJ_UINT32 i, j;

                    if (OPJ_FALSE == opj_t1_decode_cblk(
                                            t1,
                                            cblk,
                                            band->bandno,
                                            (OPJ_UINT32)tccp->roishift,
                                            tccp->cblksty)) {
                            return OPJ_FALSE;
                    }

					x = cblk->x0 - band->x0;
					y = cblk->y0 - band->y0;
					if (band->bandno & 1) {
						opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
						x += pres->x1 - pres->x0;
					}
					if (band->bandno & 2) {
						opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
						y += pres->y1 - pres->y0;
					}

					datap=t1->data;
					cblk_w = t1->w;
					cblk_h = t1->h;

					if (tccp->roishift) {
						OPJ_INT32 thresh = 1 << tccp->roishift;
						for (j = 0; j < cblk_h; ++j) {
							for (i = 0; i < cblk_w; ++i) {
								OPJ_INT32 val = datap[(j * cblk_w) + i];
								OPJ_INT32 mag = abs(val);
								if (mag >= thresh) {
									mag >>= tccp->roishift;
									datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
								}
							}
						}
					}
					if (tccp->qmfbid == 1) {
                        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_UINT32)y * tile_w + (OPJ_UINT32)x];
						for (j = 0; j < cblk_h; ++j) {
							for (i = 0; i < cblk_w; ++i) {
								OPJ_INT32 tmp = datap[(j * cblk_w) + i];
								((OPJ_INT32*)tiledp)[(j * tile_w) + i] = tmp/2;
							}
						}
					} else {		/* if (tccp->qmfbid == 0) */
                        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_UINT32)y * tile_w + (OPJ_UINT32)x];
						for (j = 0; j < cblk_h; ++j) {
                            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
							for (i = 0; i < cblk_w; ++i) {
                                OPJ_FLOAT32 tmp = (OPJ_FLOAT32)*datap * band->stepsize;
                                *tiledp2 = tmp;
                                datap++;
                                tiledp2++;
							}
                            tiledp += tile_w;
						}
					}
				} /* cblkno */
			} /* precno */
		} /* bandno */
	} /* resno */
        return OPJ_TRUE;
}